

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_scanner.cpp
# Opt level: O2

void __thiscall duckdb::SkipScanner::FinalizeChunkProcess(SkipScanner *this)

{
  idx_t *piVar1;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  bool bVar2;
  CSVBufferManager *pos;
  CSVBufferHandle *this_01;
  data_ptr_t pdVar3;
  CSVStateMachine *pCVar4;
  
  this_00 = &(this->super_BaseScanner).cur_buffer_handle;
  while( true ) {
    bVar2 = BaseScanner::FinishedFile(&this->super_BaseScanner);
    if ((bVar2) || ((this->result).rows_to_skip <= (this->result).row_count)) break;
    pos = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                    (&(this->super_BaseScanner).buffer_manager);
    (this->super_BaseScanner).iterator.pos.buffer_idx =
         (this->super_BaseScanner).iterator.pos.buffer_idx + 1;
    CSVBufferManager::GetBuffer((CSVBufferManager *)&stack0xffffffffffffffc0,(idx_t)pos);
    shared_ptr<duckdb::CSVBufferHandle,_true>::operator=
              (this_00,(shared_ptr<duckdb::CSVBufferHandle,_true> *)&stack0xffffffffffffffc0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    if ((this->super_BaseScanner).cur_buffer_handle.internal.
        super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (this->super_BaseScanner).iterator.pos.buffer_pos = 0;
      this_01 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
      pdVar3 = BufferHandle::Ptr(&this_01->handle);
      (this->super_BaseScanner).buffer_handle_ptr = (char *)pdVar3;
      BaseScanner::Process<duckdb::SkipResult>(&this->super_BaseScanner,&this->result);
    }
  }
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                     (&(this->super_BaseScanner).state_machine);
  if (((pCVar4->options->dialect_options).state_machine_options.new_line.value == CARRY_ON) &&
     ((this->super_BaseScanner).states.states[1] == CARRIAGE_RETURN)) {
    piVar1 = &(this->super_BaseScanner).iterator.pos.buffer_pos;
    *piVar1 = *piVar1 + 1;
  }
  bVar2 = BaseScanner::FinishedFile(&this->super_BaseScanner);
  (this->super_BaseScanner).iterator.done = bVar2;
  return;
}

Assistant:

void SkipScanner::FinalizeChunkProcess() {
	// We continue skipping until we skipped enough rows, or we have nothing else to read.
	while (!FinishedFile() && result.row_count < result.rows_to_skip) {
		cur_buffer_handle = buffer_manager->GetBuffer(++iterator.pos.buffer_idx);
		if (cur_buffer_handle) {
			iterator.pos.buffer_pos = 0;
			buffer_handle_ptr = cur_buffer_handle->Ptr();
			Process(result);
		}
	}
	// Skip Carriage Return
	if (state_machine->options.dialect_options.state_machine_options.new_line == NewLineIdentifier::CARRY_ON &&
	    states.states[1] == CSVState::CARRIAGE_RETURN) {
		iterator.pos.buffer_pos++;
	}
	iterator.done = FinishedFile();
}